

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-trainer.cc
# Opt level: O2

void normalize_digital_lower(string *line)

{
  byte bVar1;
  pointer pcVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  
  uVar3 = 0;
  do {
    uVar4 = (ulong)uVar3;
    if (line->_M_string_length <= uVar4) {
      return;
    }
    pcVar2 = (line->_M_dataplus)._M_p;
    bVar1 = pcVar2[uVar4];
    if ('/' < (char)bVar1) {
      bVar5 = 0x30;
      if (0x39 < bVar1) {
        if (0x19 < (byte)(bVar1 + 0xbf)) goto LAB_001d7feb;
        bVar5 = bVar1 | 0x20;
      }
      pcVar2[uVar4] = bVar5;
    }
LAB_001d7feb:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void normalize_digital_lower(string& line){
  for(unsigned i = 0; i < line.size(); i ++){
    if(line[i] >= '0' && line[i] <= '9'){
      line[i] = '0';
    }
    else if(line[i] >= 'A' && line[i] <= 'Z'){
      line[i] = line[i] - 'A' + 'a';
    }
  }
}